

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O0

void __thiscall GrpParser::declarationList(GrpParser *this)

{
  int iVar1;
  RefCount<AST> *in_RDI;
  GrpParser *unaff_retaddr;
  ParserException *ex;
  RefAST declarationList_AST;
  ASTPair currentAST;
  GrpParser *in_stack_00000140;
  ASTPair *in_stack_ffffffffffffff90;
  RefCount<AST> *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  RefAST *this_00;
  RefAST *in_stack_ffffffffffffffd0;
  ASTPair *in_stack_ffffffffffffffd8;
  ASTFactory *in_stack_ffffffffffffffe0;
  
  this_00 = &nullAST;
  RefCount<AST>::operator=(&nullAST,in_RDI);
  ASTPair::ASTPair((ASTPair *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  RefCount<AST>::RefCount
            ((RefCount<AST> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff98);
  do {
    while (iVar1 = (*(code *)in_RDI->ref[2].ptr)(in_RDI,1), iVar1 == 9) {
LAB_001efd02:
      topDecl(unaff_retaddr);
      in_stack_ffffffffffffff90 = (ASTPair *)(in_RDI + 6);
      RefCount<AST>::RefCount
                ((RefCount<AST> *)CONCAT44(iVar1,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff98);
      ASTFactory::addASTChild
                (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      RefCount<AST>::~RefCount(&in_stack_ffffffffffffff90->root);
    }
    if (iVar1 != 0xd) {
      if (iVar1 == 0xe) goto LAB_001efd02;
      if ((iVar1 != 0x17) && (iVar1 != 0x39)) {
        RefCount<AST>::operator=(this_00,in_RDI);
        RefCount<AST>::operator=(this_00,in_RDI);
        RefCount<AST>::~RefCount(&in_stack_ffffffffffffff90->root);
        ASTPair::~ASTPair(in_stack_ffffffffffffff90);
        return;
      }
    }
    globalDecl(in_stack_00000140);
    in_stack_ffffffffffffff98 = in_RDI + 6;
    RefCount<AST>::RefCount
              ((RefCount<AST> *)CONCAT44(iVar1,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98)
    ;
    ASTFactory::addASTChild
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    RefCount<AST>::~RefCount(&in_stack_ffffffffffffff90->root);
  } while( true );
}

Assistant:

void GrpParser::declarationList() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST declarationList_AST = nullAST;
	
	try {      // for error handling
		{
		do {
			switch ( LA(1)) {
			case IDENT:
			case LITERAL_glyph:
			case LITERAL_position:
			{
				globalDecl();
				astFactory.addASTChild(currentAST, returnAST);
				break;
			}
			case LITERAL_environment:
			case LITERAL_table:
			{
				topDecl();
				astFactory.addASTChild(currentAST, returnAST);
				break;
			}
			default:
			{
				goto _loop4;
			}
			}
		} while (true);
		_loop4:;
		}
		declarationList_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_0);
	}
	returnAST = declarationList_AST;
}